

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *targetName;
  uint uVar2;
  cmMakefile *this_00;
  int iVar3;
  char *pcVar4;
  char *__s2;
  long lVar5;
  _Hash_node_base *p_Var6;
  pointer ppcVar7;
  string fastTarget;
  string compiler;
  string make;
  char *in_stack_ffffffffffffff30;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MAKE_PROGRAM","");
  pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_70);
  std::__cxx11::string::string((string *)local_50,pcVar4,(allocator *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  if ((lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"all","");
    AppendTarget(this,fout,&local_90,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,(char *)local_50[0],mf,
                 in_stack_ffffffffffffff30,sourceFileFlags,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clean","");
    AppendTarget(this,fout,&local_90,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,(char *)local_50[0],mf,
                 in_stack_ffffffffffffff30,sourceFileFlags,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar7 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = (*ppcVar7)->Makefile;
      for (p_Var6 = (this_00->Targets)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0
          ; p_Var6 = p_Var6->_M_nxt) {
        targetName = (string *)(p_Var6 + 1);
        uVar2 = *(uint *)&p_Var6[0x61]._M_nxt;
        if (uVar2 < 5) {
          AppendTarget(this,fout,targetName,*ppcVar7,(cmTarget *)(p_Var6 + 5),(char *)local_50[0],
                       this_00,in_stack_ffffffffffffff30,sourceFileFlags,false);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,p_Var6[1]._M_nxt,
                     (long)&(p_Var6[1]._M_nxt)->_M_nxt + (long)&(p_Var6[2]._M_nxt)->_M_nxt);
          std::__cxx11::string::append((char *)&local_90);
          AppendTarget(this,fout,&local_90,*ppcVar7,(cmTarget *)(p_Var6 + 5),(char *)local_50[0],
                       this_00,in_stack_ffffffffffffff30,sourceFileFlags,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else if (uVar2 == 5) {
          lVar5 = std::__cxx11::string::find((char *)targetName,0x510b9c,0);
          if (((lVar5 != 0) ||
              (iVar3 = std::__cxx11::string::compare((char *)targetName), iVar3 == 0)) &&
             ((lVar5 = std::__cxx11::string::find((char *)targetName,0x510ba4,0), lVar5 != 0 ||
              (iVar3 = std::__cxx11::string::compare((char *)targetName), iVar3 == 0)))) {
            lVar5 = std::__cxx11::string::find((char *)targetName,0x510baf,0);
            if (lVar5 == 0) {
              iVar3 = std::__cxx11::string::compare((char *)targetName);
              goto LAB_003c9d9b;
            }
LAB_003c9df6:
            AppendTarget(this,fout,targetName,*ppcVar7,(cmTarget *)0x0,(char *)local_50[0],this_00,
                         in_stack_ffffffffffffff30,sourceFileFlags,false);
          }
        }
        else if (uVar2 == 6) {
          pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this_00);
          __s2 = cmMakefile::GetHomeOutputDirectory(this_00);
          iVar3 = strcmp(pcVar4,__s2);
LAB_003c9d9b:
          if (iVar3 == 0) goto LAB_003c9df6;
        }
      }
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 !=
             (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}